

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void SettingsHandlerWindow_WriteAll
               (ImGuiContext *imgui_ctx,ImGuiSettingsHandler *handler,ImGuiTextBuffer *buf)

{
  float fVar1;
  uint uVar2;
  ImGuiWindow *pIVar3;
  ulong uVar4;
  ImGuiWindowSettings *pIVar5;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  
  uVar2 = (imgui_ctx->Windows).Size;
  uVar4 = (ulong)uVar2;
  if (uVar2 != 0) {
    uVar8 = 0;
    do {
      if ((long)(int)uVar4 <= (long)uVar8) {
        pcVar7 = "value_type &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
        goto LAB_0017ea65;
      }
      pIVar3 = (imgui_ctx->Windows).Data[uVar8];
      if ((pIVar3->Flags & 0x100) == 0) {
        pIVar5 = ImGui::FindWindowSettings(pIVar3->ID);
        if (pIVar5 == (ImGuiWindowSettings *)0x0) {
          pIVar5 = AddWindowSettings(pIVar3->Name);
        }
        pIVar5->Pos = pIVar3->Pos;
        pIVar5->Size = pIVar3->SizeFull;
        pIVar5->Collapsed = pIVar3->Collapsed;
      }
      uVar8 = uVar8 + 1;
      uVar4 = (ulong)(uint)(imgui_ctx->Windows).Size;
    } while (uVar8 != uVar4);
  }
  ImGuiTextBuffer::reserve(buf,(buf->Buf).Size + (imgui_ctx->SettingsWindows).Size * 0x60 + -1);
  uVar2 = (imgui_ctx->SettingsWindows).Size;
  uVar4 = (ulong)uVar2;
  if (uVar2 != 0) {
    lVar9 = 0x1c;
    uVar8 = 0;
    do {
      if ((long)(int)uVar4 <= (long)uVar8) {
        pcVar7 = 
        "value_type &ImVector<ImGuiWindowSettings>::operator[](int) [T = ImGuiWindowSettings]";
LAB_0017ea65:
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                      ,0x4c0,pcVar7);
      }
      pIVar5 = (imgui_ctx->SettingsWindows).Data;
      fVar1 = *(float *)((long)pIVar5 + lVar9 + -0x10);
      if ((fVar1 != 3.4028235e+38) || (NAN(fVar1))) {
        pcVar7 = *(char **)((long)pIVar5 + lVar9 + -0x1c);
        pcVar6 = strstr(pcVar7,"###");
        if (pcVar6 != (char *)0x0) {
          pcVar7 = pcVar6;
        }
        ImGuiTextBuffer::appendf(buf,"[%s][%s]\n",handler->TypeName,pcVar7);
        ImGuiTextBuffer::appendf
                  (buf,"Pos=%d,%d\n",(ulong)(uint)(int)*(float *)((long)pIVar5 + lVar9 + -0x10),
                   (ulong)(uint)(int)*(float *)((long)pIVar5 + lVar9 + -0xc));
        ImGuiTextBuffer::appendf
                  (buf,"Size=%d,%d\n",(ulong)(uint)(int)*(float *)((long)pIVar5 + lVar9 + -8),
                   (ulong)(uint)(int)*(float *)((long)pIVar5 + lVar9 + -4));
        ImGuiTextBuffer::appendf(buf,"Collapsed=%d\n",(ulong)*(byte *)((long)&pIVar5->Name + lVar9))
        ;
        ImGuiTextBuffer::appendf(buf,"\n");
      }
      uVar8 = uVar8 + 1;
      uVar4 = (ulong)(uint)(imgui_ctx->SettingsWindows).Size;
      lVar9 = lVar9 + 0x20;
    } while (uVar8 != uVar4);
  }
  return;
}

Assistant:

static void SettingsHandlerWindow_WriteAll(ImGuiContext* imgui_ctx, ImGuiSettingsHandler* handler, ImGuiTextBuffer* buf)
{
    // Gather data from windows that were active during this session
    ImGuiContext& g = *imgui_ctx;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Flags & ImGuiWindowFlags_NoSavedSettings)
            continue;
        ImGuiWindowSettings* settings = ImGui::FindWindowSettings(window->ID);
        if (!settings)
            settings = AddWindowSettings(window->Name);
        settings->Pos = window->Pos;
        settings->Size = window->SizeFull;
        settings->Collapsed = window->Collapsed;
    }

    // Write a buffer
    // If a window wasn't opened in this session we preserve its settings
    buf->reserve(buf->size() + g.SettingsWindows.Size * 96); // ballpark reserve
    for (int i = 0; i != g.SettingsWindows.Size; i++)
    {
        const ImGuiWindowSettings* settings = &g.SettingsWindows[i];
        if (settings->Pos.x == FLT_MAX)
            continue;
        const char* name = settings->Name;
        if (const char* p = strstr(name, "###"))  // Skip to the "###" marker if any. We don't skip past to match the behavior of GetID()
            name = p;
        buf->appendf("[%s][%s]\n", handler->TypeName, name);
        buf->appendf("Pos=%d,%d\n", (int)settings->Pos.x, (int)settings->Pos.y);
        buf->appendf("Size=%d,%d\n", (int)settings->Size.x, (int)settings->Size.y);
        buf->appendf("Collapsed=%d\n", settings->Collapsed);
        buf->appendf("\n");
    }
}